

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_test.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  rt_variable<viennamath::rt_expression_interface<double>_> *extraout_RDX;
  rt_variable<viennamath::rt_expression_interface<double>_> *extraout_RDX_00;
  rt_variable<viennamath::rt_expression_interface<double>_> *other;
  numeric_type nVar2;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  ct_constant<8L> c8;
  expr e;
  expr e2;
  variable x;
  expr e1;
  rt_constant<long,_viennamath::rt_expression_interface<double>_> c6;
  rt_constant<double,_viennamath::rt_expression_interface<double>_> c4;
  variable y;
  expr e3;
  variable z;
  ct_constant<8L> local_109;
  rt_expr<viennamath::rt_expression_interface<double>_> local_108;
  auto_ptr<const_viennamath::rt_expression_interface<double>_> local_100;
  type local_f8;
  rt_variable<viennamath::rt_expression_interface<double>_> local_d8;
  auto_ptr<const_viennamath::rt_expression_interface<double>_> local_c8;
  rt_constant<long,_viennamath::rt_expression_interface<double>_> local_c0;
  rt_constant<double,_viennamath::rt_expression_interface<double>_> local_b0;
  rt_variable<viennamath::rt_expression_interface<double>_> local_a0;
  auto_ptr<const_viennamath::rt_expression_interface<double>_> local_90;
  auto_ptr<const_viennamath::rt_expression_interface<double>_> local_88;
  auto_ptr<const_viennamath::rt_expression_interface<double>_> local_80;
  auto_ptr<const_viennamath::rt_expression_interface<double>_> local_78;
  auto_ptr<const_viennamath::rt_expression_interface<double>_> local_70;
  type local_68;
  rt_variable<viennamath::rt_expression_interface<double>_> local_48;
  rt_unary_expr<viennamath::rt_expression_interface<double>_> local_38;
  rt_variable<viennamath::rt_expression_interface<double>_> local_20;
  
  local_d8.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_expression_interface_001331a8;
  local_d8.id_ = 0;
  local_a0.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_expression_interface_001331a8;
  local_a0.id_ = 1;
  local_48.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_expression_interface_001331a8;
  local_48.id_ = 2;
  local_b0.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_expression_interface_001333a8;
  local_b0.s = 4.0;
  local_c0.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_expression_interface_00133468;
  local_c0.s = 6;
  viennamath::result_of::
  add<viennamath::rt_variable<viennamath::rt_expression_interface<double>_>,_viennamath::rt_variable<viennamath::rt_expression_interface<double>_>,_false,_false>
  ::instance(&local_f8,&local_d8,&local_a0);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_c8,&local_f8);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_f8);
  viennamath::result_of::
  add<viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_constant<8L>,_false,_true>
  ::instance(&local_f8,&local_b0,&local_109);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_100,&local_f8);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_f8);
  viennamath::result_of::
  add<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_false,_false>
  ::instance(&local_f8,(rt_expr<viennamath::rt_expression_interface<double>_> *)&local_c8,
             (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_100);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_70,&local_f8);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_f8);
  local_108.rt_expr_._M_ptr =
       (auto_ptr<const_viennamath::rt_expression_interface<double>_>)
       (rt_expression_interface<double> *)0x0;
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            (&local_108,(rt_expr<viennamath::rt_expression_interface<double>_> *)&local_c8,
             (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_100);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>>
            (&local_108,(rt_expr<viennamath::rt_expression_interface<double>_> *)&local_c8,&local_d8
            );
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>>
            (&local_108,(rt_expr<viennamath::rt_expression_interface<double>_> *)&local_c8,&local_b0
            );
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>>
            (&local_108,(rt_expr<viennamath::rt_expression_interface<double>_> *)&local_c8,&local_c0
            );
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>>
            (&local_108,(rt_expr<viennamath::rt_expression_interface<double>_> *)&local_c8,
             &local_109);
  local_f8.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&DAT_4005bcd35a858794;
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_expr<viennamath::rt_expression_interface<double>>,double>
            (&local_108,(rt_expr<viennamath::rt_expression_interface<double>_> *)&local_c8,
             (double *)&local_f8);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>,viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            (&local_108,&local_d8,
             (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_100);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>>
            (&local_108,&local_d8,&local_d8);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>>
            (&local_108,&local_d8,&local_b0);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>>
            (&local_108,&local_d8,&local_c0);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>>
            (&local_108,&local_d8,&local_109);
  local_f8.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&DAT_4005bcd35a858794;
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>,double>
            (&local_108,&local_d8,(double *)&local_f8);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>,viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            (&local_108,&local_a0,
             (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_100);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>>
            (&local_108,&local_a0,&local_d8);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>>
            (&local_108,&local_a0,&local_b0);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>>
            (&local_108,&local_a0,&local_c0);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>>
            (&local_108,&local_a0,&local_109);
  local_f8.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&DAT_4005bcd35a858794;
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>,double>
            (&local_108,&local_a0,(double *)&local_f8);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>,viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            (&local_108,&local_b0,
             (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_100);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>>
            (&local_108,&local_b0,&local_d8);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>,viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>>
            (&local_108,&local_b0,&local_b0);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>>
            (&local_108,&local_b0,&local_c0);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>>
            (&local_108,&local_b0,&local_109);
  local_f8.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&DAT_4005bcd35a858794;
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>,double>
            (&local_108,&local_b0,(double *)&local_f8);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>,viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            (&local_108,&local_c0,
             (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_100);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>>
            (&local_108,&local_c0,&local_d8);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>,viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>>
            (&local_108,&local_c0,&local_b0);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>>
            (&local_108,&local_c0,&local_c0);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>>
            (&local_108,&local_c0,&local_109);
  local_f8.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&DAT_4005bcd35a858794;
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>,double>
            (&local_108,&local_c0,(double *)&local_f8);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>,viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            (&local_108,&local_109,
             (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_100);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>>
            (&local_108,&local_109,&local_d8);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>,viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>>
            (&local_108,&local_109,&local_b0);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>>
            (&local_108,&local_109,&local_c0);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>,viennamath::ct_constant<8l>>
            (&local_108,&local_109,&local_109);
  local_f8.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&DAT_4005bcd35a858794;
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>,double>
            (&local_108,&local_109,(double *)&local_f8);
  local_f8.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&DAT_4005bcd35a858794;
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,double,viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            (&local_108,(double *)&local_f8,
             (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_100);
  local_f8.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&DAT_4005bcd35a858794;
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,double,viennamath::rt_variable<viennamath::rt_expression_interface<double>>>
            (&local_108,(double *)&local_f8,&local_d8);
  local_f8.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&DAT_4005bcd35a858794;
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,double,viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>>
            (&local_108,(double *)&local_f8,&local_b0);
  local_f8.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&DAT_4005bcd35a858794;
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,double,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>>
            (&local_108,(double *)&local_f8,&local_c0);
  local_f8.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&DAT_4005bcd35a858794;
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,double,viennamath::ct_constant<8l>>
            (&local_108,(double *)&local_f8,&local_109);
  local_f8.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&DAT_4005bcd35a858794;
  local_68.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&DAT_4005bcd35a858794;
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,double,double>
            (&local_108,(double *)&local_f8,(double *)&local_68);
  poVar1 = std::operator<<((ostream *)&std::cout,"************************************************")
  ;
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"*****     TEST COMPLETED SUCCESSFULLY!     *****")
  ;
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"************************************************")
  ;
  std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = viennamath::operator<<((ostream *)&std::cout,&local_d8);
  std::operator<<(poVar1,": ");
  local_20.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_expression_interface_001331a8;
  local_20.id_ = local_d8.id_;
  nVar2 = viennamath::
          eval<viennamath::rt_expression_interface<double>,viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>>
                    (&local_20,&local_b0);
  poVar1 = std::ostream::_M_insert<double>(nVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = viennamath::operator<<
                     ((ostream *)&std::cout,
                      (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_100);
  std::operator<<(poVar1,": ");
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_78,
             (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_100);
  (*(local_78._M_ptr)->_vptr_rt_expression_interface[6])(local_b0.s);
  poVar1 = std::ostream::_M_insert<double>(extraout_XMM0_Qa);
  std::endl<char,std::char_traits<char>>(poVar1);
  if (local_78._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_78._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  viennamath::result_of::
  add<viennamath::rt_variable<viennamath::rt_expression_interface<double>_>,_viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_false,_false>
  ::instance(&local_f8,&local_d8,(rt_expr<viennamath::rt_expression_interface<double>_> *)&local_100
            );
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::operator=(&local_108,&local_f8)
  ;
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_f8);
  poVar1 = viennamath::operator<<((ostream *)&std::cout,&local_108);
  std::operator<<(poVar1,": ");
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_80,&local_108);
  (*(local_80._M_ptr)->_vptr_rt_expression_interface[6])(local_b0.s);
  poVar1 = std::ostream::_M_insert<double>(extraout_XMM0_Qa_00);
  std::endl<char,std::char_traits<char>>(poVar1);
  if (local_80._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_80._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  poVar1 = viennamath::operator<<((ostream *)&std::cout,&local_108);
  std::operator<<(poVar1,": ");
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_88,&local_108);
  (*(local_88._M_ptr)->_vptr_rt_expression_interface[6])((double)local_c0.s);
  poVar1 = std::ostream::_M_insert<double>(extraout_XMM0_Qa_01);
  std::endl<char,std::char_traits<char>>(poVar1);
  if (local_88._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_88._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  poVar1 = viennamath::operator<<((ostream *)&std::cout,&local_108);
  std::operator<<(poVar1,": ");
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_90,&local_108);
  (*(local_90._M_ptr)->_vptr_rt_expression_interface[6])(0x4020000000000000);
  poVar1 = std::ostream::_M_insert<double>(extraout_XMM0_Qa_02);
  std::endl<char,std::char_traits<char>>(poVar1);
  if (local_90._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_90._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  unary_test<viennamath::rt_variable<viennamath::rt_expression_interface<double>>>(&local_d8);
  viennamath::result_of::
  add<viennamath::rt_variable<viennamath::rt_expression_interface<double>_>,_viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>,_false,_false>
  ::instance(&local_f8,&local_d8,&local_b0);
  unary_test<viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>>>(&local_f8);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_f8);
  viennamath::result_of::
  mult<viennamath::rt_variable<viennamath::rt_expression_interface<double>_>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_false,_false>
  ::instance(&local_f8,&local_a0,&local_c0);
  unary_test<viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>>>(&local_f8);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_f8);
  viennamath::result_of::
  div<viennamath::rt_variable<viennamath::rt_expression_interface<double>_>,_viennamath::rt_variable<viennamath::rt_expression_interface<double>_>,_false,_false>
  ::instance(&local_f8,&local_a0,&local_d8);
  unary_test<viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>>>(&local_f8);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_f8);
  viennamath::result_of::
  add<viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_constant<8L>,_false,_true>
  ::instance(&local_f8,&local_c0,&local_109);
  unary_test<viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>>>(&local_f8);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_f8);
  viennamath::result_of::
  subtract<viennamath::rt_variable<viennamath::rt_expression_interface<double>_>,_viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>,_false,_false>
  ::instance(&local_68,&local_d8,&local_b0);
  viennamath::result_of::
  subtract<viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>,_viennamath::rt_variable<viennamath::rt_expression_interface<double>_>,_false,_false>
  ::instance(&local_f8,&local_68,&local_a0);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::operator=(&local_108,&local_f8)
  ;
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_f8);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_68);
  poVar1 = std::operator<<((ostream *)&std::cout,"Replacing x in ");
  poVar1 = viennamath::operator<<(poVar1,&local_108);
  poVar1 = std::operator<<(poVar1," with ");
  poVar1 = viennamath::operator<<(poVar1,&local_c0);
  poVar1 = std::operator<<(poVar1," leads to ");
  viennamath::
  substitute<viennamath::rt_expression_interface<double>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>>
            ((viennamath *)&local_f8,&local_d8,&local_c0,&local_108);
  poVar1 = viennamath::operator<<
                     (poVar1,(rt_expr<viennamath::rt_expression_interface<double>_> *)&local_f8);
  std::endl<char,std::char_traits<char>>(poVar1);
  other = extraout_RDX;
  if (local_f8.super_rt_expression_interface<double>._vptr_rt_expression_interface !=
      (_func_int **)0x0) {
    (**(code **)(*local_f8.super_rt_expression_interface<double>._vptr_rt_expression_interface + 8))
              ();
    other = extraout_RDX_00;
  }
  viennamath::exp<viennamath::rt_expression_interface<double>>
            (&local_38,(viennamath *)&local_d8,other);
  viennamath::result_of::
  subtract<viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>,_viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>,_false,_false>
  ::instance(&local_68,&local_38,&local_b0);
  viennamath::result_of::
  subtract<viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>,_viennamath::rt_variable<viennamath::rt_expression_interface<double>_>,_false,_false>
  ::instance(&local_f8,&local_68,&local_a0);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::operator=(&local_108,&local_f8)
  ;
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_f8);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_68);
  viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::~rt_unary_expr(&local_38)
  ;
  poVar1 = std::operator<<((ostream *)&std::cout,"Replacing x in ");
  poVar1 = viennamath::operator<<(poVar1,&local_108);
  poVar1 = std::operator<<(poVar1," with ");
  poVar1 = viennamath::operator<<(poVar1,&local_c0);
  poVar1 = std::operator<<(poVar1," leads to ");
  viennamath::
  substitute<viennamath::rt_expression_interface<double>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>>
            ((viennamath *)&local_f8,&local_d8,&local_c0,&local_108);
  poVar1 = viennamath::operator<<
                     (poVar1,(rt_expr<viennamath::rt_expression_interface<double>_> *)&local_f8);
  std::endl<char,std::char_traits<char>>(poVar1);
  if (local_f8.super_rt_expression_interface<double>._vptr_rt_expression_interface !=
      (_func_int **)0x0) {
    (**(code **)(*local_f8.super_rt_expression_interface<double>._vptr_rt_expression_interface + 8))
              ();
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"--- Involved types ---");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"x: ");
  poVar1 = viennamath::operator<<(poVar1,&local_d8);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"y: ");
  poVar1 = viennamath::operator<<(poVar1,&local_a0);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"z: ");
  poVar1 = viennamath::operator<<(poVar1,&local_48);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"c4: ");
  poVar1 = viennamath::operator<<(poVar1,&local_b0);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"c6: ");
  poVar1 = viennamath::operator<<(poVar1,&local_c0);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"c8: ");
  poVar1 = viennamath::operator<<(poVar1,&local_109);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"e1: ");
  poVar1 = viennamath::operator<<
                     (poVar1,(rt_expr<viennamath::rt_expression_interface<double>_> *)&local_c8);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"e2: ");
  poVar1 = viennamath::operator<<
                     (poVar1,(rt_expr<viennamath::rt_expression_interface<double>_> *)&local_100);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"e3: ");
  poVar1 = viennamath::operator<<
                     (poVar1,(rt_expr<viennamath::rt_expression_interface<double>_> *)&local_70);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"e: ");
  poVar1 = viennamath::operator<<(poVar1,&local_108);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<((ostream *)&std::cout,"************************************************")
  ;
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"*****     TEST COMPLETED SUCCESSFULLY!     *****")
  ;
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"************************************************")
  ;
  std::endl<char,std::char_traits<char>>(poVar1);
  if (local_108.rt_expr_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(*(_func_int ***)local_108.rt_expr_._M_ptr)[1])();
  }
  if (local_70._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_70._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_100._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_100._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_c8._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_c8._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  return 0;
}

Assistant:

int main()
{
  viennamath::variable x(0);
  viennamath::variable y(1);
  viennamath::variable z(2);
  viennamath::rt_constant<double> c4(4.0);
  viennamath::rt_constant<long> c6(6);
  viennamath::ct_constant<8> c8;
  viennamath::expr e1 = x + y;
  viennamath::expr e2 = c4 + c8;
  viennamath::expr e3 = e1 + e2;
  viennamath::expr e;

  //compilation checks:
  operations_test(e, e1, e2);
  operations_test(e, e1, x);
  operations_test(e, e1, c4);
  operations_test(e, e1, c6);
  operations_test(e, e1, c8);
  operations_test(e, e1, 2.7172);

  operations_test(e, x, e2);
  operations_test(e, x, x);
  operations_test(e, x, c4);
  operations_test(e, x, c6);
  operations_test(e, x, c8);
  operations_test(e, x, 2.7172);

  operations_test(e, y, e2);
  operations_test(e, y, x);
  operations_test(e, y, c4);
  operations_test(e, y, c6);
  operations_test(e, y, c8);
  operations_test(e, y, 2.7172);

  operations_test(e, c4, e2);
  operations_test(e, c4, x);
  operations_test(e, c4, c4);
  operations_test(e, c4, c6);
  operations_test(e, c4, c8);
  operations_test(e, c4, 2.7172);

  operations_test(e, c6, e2);
  operations_test(e, c6, x);
  operations_test(e, c6, c4);
  operations_test(e, c6, c6);
  operations_test(e, c6, c8);
  operations_test(e, c6, 2.7172);

  operations_test(e, c8, e2);
  operations_test(e, c8, x);
  operations_test(e, c8, c4);
  operations_test(e, c8, c6);
  operations_test(e, c8, c8);
  operations_test(e, c8, 2.7172);

  operations_test(e, 2.7172, e2);
  operations_test(e, 2.7172, x);
  operations_test(e, 2.7172, c4);
  operations_test(e, 2.7172, c6);
  operations_test(e, 2.7172, c8);
  operations_test(e, 2.7172, 2.7172);

  std::cout << "************************************************" << std::endl;
  std::cout << "*****     TEST COMPLETED SUCCESSFULLY!     *****" << std::endl;
  std::cout << "************************************************" << std::endl;
  std::cout << std::endl;


  std::cout << x << ": " << viennamath::eval(x, c4) << std::endl;
  std::cout << e2  << ": " << viennamath::eval(e2, c4) << std::endl;
  e = x + e2;
  std::cout << e << ": " << viennamath::eval(e, c4) << std::endl;
  std::cout << e << ": " << viennamath::eval(e, c6) << std::endl;
  std::cout << e << ": " << viennamath::eval(e, c8) << std::endl;

  unary_test(x);
  unary_test(x+c4);
  unary_test(y*c6);
  unary_test(y/x);
  unary_test(c6+c8);



  e = x - c4 - y;
  std::cout << "Replacing x in " << e
            << " with " << c6
            << " leads to " << viennamath::substitute(x, c6, e) << std::endl;

  e = viennamath::exp(x) - c4 - y;
  std::cout << "Replacing x in " << e
            << " with " << c6
            << " leads to " << viennamath::substitute(x, c6, e) << std::endl;

  std::cout << "--- Involved types ---" << std::endl;
  std::cout << "x: " << x << std::endl;
  std::cout << "y: " << y << std::endl;
  std::cout << "z: " << z << std::endl;
  std::cout << "c4: " << c4 << std::endl;
  std::cout << "c6: " << c6 << std::endl;
  std::cout << "c8: " << c8 << std::endl;
  std::cout << "e1: " << e1 << std::endl;
  std::cout << "e2: " << e2 << std::endl;
  std::cout << "e3: " << e3 << std::endl;
  std::cout << "e: " << e << std::endl;

  std::cout << std::endl;

  std::cout << "************************************************" << std::endl;
  std::cout << "*****     TEST COMPLETED SUCCESSFULLY!     *****" << std::endl;
  std::cout << "************************************************" << std::endl;


  return EXIT_SUCCESS;
}